

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImportTable
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  undefined4 uVar1;
  Enum EVar2;
  undefined8 uVar3;
  string local_c8;
  char local_a8 [8];
  char buf [100];
  Index import_index_local;
  BinaryReaderLogging *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  buf._92_4_ = import_index;
  unique0x100000e7 = this;
  anon_unknown_24::SPrintLimits(local_a8,100,elem_limits);
  WriteIndent(this);
  uVar1 = buf._92_4_;
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_c8,&elem_type);
  uVar3 = std::__cxx11::string::c_str();
  Stream::Writef(this_00,"OnImportTable(import_index: %u, table_index: %u, elem_type: %s, %s)\n",
                 (ulong)(uint)uVar1,(ulong)table_index,uVar3,local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x13])
                    (this->reader_,(ulong)(uint)buf._92_4_,module_name._M_len,module_name._M_str,
                     field_name._M_len,field_name._M_str,table_index,elem_type,elem_limits);
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderLogging::OnImportTable(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnImportTable(import_index: %" PRIindex ", table_index: %" PRIindex
       ", elem_type: %s, %s)\n",
       import_index, table_index, elem_type.GetName().c_str(), buf);
  return reader_->OnImportTable(import_index, module_name, field_name,
                                table_index, elem_type, elem_limits);
}